

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cProgramInterfaceQueryTests.cpp
# Opt level: O3

long __thiscall gl4cts::anon_unknown_0::AtomicCounterSimple::Run(AtomicCounterSimple *this)

{
  CallLogWrapper *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  GLint *pGVar2;
  GLint *pGVar3;
  _Rb_tree_header *p_Var4;
  _Rb_tree_color _Var5;
  _Rb_tree_color _Var6;
  undefined8 src_vs;
  _Base_ptr p_Var7;
  GLuint program;
  mapped_type *pmVar8;
  _Base_ptr p_Var9;
  _Base_ptr p_Var10;
  _Base_ptr p_Var11;
  uint uVar12;
  long lVar13;
  GLint res;
  long error;
  GLenum prop;
  CallLogWrapper *local_2088;
  GLenum prop2;
  GLsizei length;
  key_type local_2078;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  indicesU;
  GLenum props2 [3];
  GLint expected [4];
  GLenum props [4];
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> exp2;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> exp;
  GLint expected3 [3];
  GLint expected2 [3];
  GLint param [1000];
  GLint param2 [1000];
  
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x16])(param,this);
  src_vs = param._0_8_;
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x17])(param2,this);
  program = PIQBase::CreateProgram((PIQBase *)this,(char *)src_vs,(char *)param2._0_8_,false);
  if ((GLint *)param2._0_8_ != param2 + 4) {
    operator_delete((void *)param2._0_8_,param2._16_8_ + 1);
  }
  pGVar2 = param + 4;
  if ((GLint *)param._0_8_ != pGVar2) {
    operator_delete((void *)param._0_8_,param._16_8_ + 1);
  }
  this_00 = &(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper.
             super_CallLogWrapper;
  glu::CallLogWrapper::glBindAttribLocation(this_00,program,0,"position");
  local_2088 = this_00;
  glu::CallLogWrapper::glBindFragDataLocation(this_00,program,0,"color");
  PIQBase::LinkProgram((PIQBase *)this,program);
  error = 0;
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xd]
  )(this,(ulong)program,0x92c0,0x92f5,3,&error);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xd]
  )(this,(ulong)program,0x92c0,0x92f7,2,&error);
  indicesU._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &indicesU._M_t._M_impl.super__Rb_tree_header._M_header;
  indicesU._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  indicesU._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  indicesU._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  indicesU._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       indicesU._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  param._0_8_ = pGVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)param,"a","");
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xf]
  )(this,(ulong)program,0x92e1,&indicesU,param,&error);
  pGVar3 = param2 + 4;
  if ((GLint *)param._0_8_ != pGVar2) {
    operator_delete((void *)param._0_8_,param._16_8_ + 1);
  }
  param._0_8_ = pGVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)param,"b","");
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xf]
  )(this,(ulong)program,0x92e1,&indicesU,param,&error);
  if ((GLint *)param._0_8_ != pGVar2) {
    operator_delete((void *)param._0_8_,param._16_8_ + 1);
  }
  param._0_8_ = pGVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)param,"c","");
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xf]
  )(this,(ulong)program,0x92e1,&indicesU,param,&error);
  if ((GLint *)param._0_8_ != pGVar2) {
    operator_delete((void *)param._0_8_,param._16_8_ + 1);
  }
  param._0_8_ = pGVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)param,"d","");
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xf]
  )(this,(ulong)program,0x92e1,&indicesU,param,&error);
  if ((GLint *)param._0_8_ != pGVar2) {
    operator_delete((void *)param._0_8_,param._16_8_ + 1);
  }
  param._0_8_ = pGVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)param,"e","");
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xf]
  )(this,(ulong)program,0x92e1,&indicesU,param,&error);
  if ((GLint *)param._0_8_ != pGVar2) {
    operator_delete((void *)param._0_8_,param._16_8_ + 1);
  }
  param._0_8_ = pGVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)param,"a","");
  pmVar8 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indicesU,(key_type *)param);
  uVar12 = *pmVar8;
  param2._0_8_ = pGVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)param2,"a","");
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x10])(this,(ulong)program,0x92e1,(ulong)uVar12,param2,&error);
  if ((GLint *)param2._0_8_ != pGVar3) {
    operator_delete((void *)param2._0_8_,param2._16_8_ + 1);
  }
  if ((GLint *)param._0_8_ != pGVar2) {
    operator_delete((void *)param._0_8_,param._16_8_ + 1);
  }
  param._0_8_ = pGVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)param,"b","");
  pmVar8 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indicesU,(key_type *)param);
  uVar12 = *pmVar8;
  param2._0_8_ = pGVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)param2,"b","");
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x10])(this,(ulong)program,0x92e1,(ulong)uVar12,param2,&error);
  if ((GLint *)param2._0_8_ != pGVar3) {
    operator_delete((void *)param2._0_8_,param2._16_8_ + 1);
  }
  if ((GLint *)param._0_8_ != pGVar2) {
    operator_delete((void *)param._0_8_,param._16_8_ + 1);
  }
  param._0_8_ = pGVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)param,"c","");
  pmVar8 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indicesU,(key_type *)param);
  uVar12 = *pmVar8;
  param2._0_8_ = pGVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)param2,"c","");
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x10])(this,(ulong)program,0x92e1,(ulong)uVar12,param2,&error);
  if ((GLint *)param2._0_8_ != pGVar3) {
    operator_delete((void *)param2._0_8_,param2._16_8_ + 1);
  }
  if ((GLint *)param._0_8_ != pGVar2) {
    operator_delete((void *)param._0_8_,param._16_8_ + 1);
  }
  param._0_8_ = pGVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)param,"d","");
  pmVar8 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indicesU,(key_type *)param);
  uVar12 = *pmVar8;
  param2._0_8_ = pGVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)param2,"d[0]","");
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x10])(this,(ulong)program,0x92e1,(ulong)uVar12,param2,&error);
  if ((GLint *)param2._0_8_ != pGVar3) {
    operator_delete((void *)param2._0_8_,param2._16_8_ + 1);
  }
  if ((GLint *)param._0_8_ != pGVar2) {
    operator_delete((void *)param._0_8_,param._16_8_ + 1);
  }
  param._0_8_ = pGVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)param,"e","");
  pmVar8 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indicesU,(key_type *)param);
  uVar12 = *pmVar8;
  param2._0_8_ = pGVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)param2,"e","");
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x10])(this,(ulong)program,0x92e1,(ulong)uVar12,param2,&error);
  if ((GLint *)param2._0_8_ != pGVar3) {
    operator_delete((void *)param2._0_8_,param2._16_8_ + 1);
  }
  if ((GLint *)param._0_8_ != pGVar2) {
    operator_delete((void *)param._0_8_,param._16_8_ + 1);
  }
  param._0_8_ = pGVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)param,"a","");
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x11])(this,(ulong)program,0x92e1,param,0xffffffff,&error);
  if ((GLint *)param._0_8_ != pGVar2) {
    operator_delete((void *)param._0_8_,param._16_8_ + 1);
  }
  param._0_8_ = pGVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)param,"b","");
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x11])(this,(ulong)program,0x92e1,param,0xffffffff,&error);
  if ((GLint *)param._0_8_ != pGVar2) {
    operator_delete((void *)param._0_8_,param._16_8_ + 1);
  }
  param._0_8_ = pGVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)param,"c","");
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x11])(this,(ulong)program,0x92e1,param,0xffffffff,&error);
  if ((GLint *)param._0_8_ != pGVar2) {
    operator_delete((void *)param._0_8_,param._16_8_ + 1);
  }
  param._0_8_ = pGVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)param,"d","");
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x11])(this,(ulong)program,0x92e1,param,0xffffffff,&error);
  if ((GLint *)param._0_8_ != pGVar2) {
    operator_delete((void *)param._0_8_,param._16_8_ + 1);
  }
  param._0_8_ = pGVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)param,"e","");
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x11])(this,(ulong)program,0x92e1,param,0xffffffff,&error);
  if ((GLint *)param._0_8_ != pGVar2) {
    operator_delete((void *)param._0_8_,param._16_8_ + 1);
  }
  param._0_8_ = pGVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)param,"d[0]","");
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x11])(this,(ulong)program,0x92e1,param,0xffffffff,&error);
  if ((GLint *)param._0_8_ != pGVar2) {
    operator_delete((void *)param._0_8_,param._16_8_ + 1);
  }
  param._0_8_ = pGVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)param,"d[1]","");
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x11])(this,(ulong)program,0x92e1,param,0xffffffff,&error);
  if ((GLint *)param._0_8_ != pGVar2) {
    operator_delete((void *)param._0_8_,param._16_8_ + 1);
  }
  param._0_8_ = pGVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)param,"d[2]","");
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x11])(this,(ulong)program,0x92e1,param,0xffffffff,&error);
  if ((GLint *)param._0_8_ != pGVar2) {
    operator_delete((void *)param._0_8_,param._16_8_ + 1);
  }
  prop = 0x9301;
  param._0_8_ = pGVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)param,"a","");
  pmVar8 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indicesU,(key_type *)param);
  glu::CallLogWrapper::glGetProgramResourceiv
            (local_2088,program,0x92e1,*pmVar8,1,&prop,1000,&length,&res);
  if ((GLint *)param._0_8_ != pGVar2) {
    operator_delete((void *)param._0_8_,param._16_8_ + 1);
  }
  props[0] = 0x9302;
  props[1] = 0x9303;
  props[2] = 0x9304;
  props[3] = 0x9305;
  param._0_8_ = pGVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)param,"a","");
  pmVar8 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indicesU,(key_type *)param);
  glu::CallLogWrapper::glGetProgramResourceiv
            (local_2088,program,0x92e1,*pmVar8,1,&prop,1000,&length,&res);
  if ((GLint *)param._0_8_ != pGVar2) {
    operator_delete((void *)param._0_8_,param._16_8_ + 1);
  }
  expected[0] = 1;
  expected[1] = 4;
  expected[2] = 1;
  param._0_8_ = pGVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)param,"a","");
  pmVar8 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indicesU,(key_type *)param);
  expected[3] = *pmVar8;
  if ((GLint *)param._0_8_ != pGVar2) {
    operator_delete((void *)param._0_8_,param._16_8_ + 1);
  }
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x13])(this,(ulong)program,0x92c0,(ulong)(uint)res,4,props,4,expected,&error);
  props2[0] = 0x9302;
  props2[1] = 0x9303;
  props2[2] = 0x9304;
  param._0_8_ = pGVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)param,"b","");
  pmVar8 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indicesU,(key_type *)param);
  glu::CallLogWrapper::glGetProgramResourceiv
            (local_2088,program,0x92e1,*pmVar8,1,&prop,1000,&length,&res);
  if ((GLint *)param._0_8_ != pGVar2) {
    operator_delete((void *)param._0_8_,param._16_8_ + 1);
  }
  expected2[0] = 2;
  expected2[1] = 8;
  expected2[2] = 2;
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x13])(this,(ulong)program,0x92c0,(ulong)(uint)res,3,props2,3,expected2,&error);
  param._0_8_ = pGVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)param,"c","");
  pmVar8 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indicesU,(key_type *)param);
  glu::CallLogWrapper::glGetProgramResourceiv
            (local_2088,program,0x92e1,*pmVar8,1,&prop,1000,&length,&res);
  if ((GLint *)param._0_8_ != pGVar2) {
    operator_delete((void *)param._0_8_,param._16_8_ + 1);
  }
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x13])(this,(ulong)program,0x92c0,(ulong)(uint)res,3,props2,3,expected2,&error);
  param._0_8_ = pGVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)param,"d","");
  pmVar8 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indicesU,(key_type *)param);
  glu::CallLogWrapper::glGetProgramResourceiv
            (local_2088,program,0x92e1,*pmVar8,1,&prop,1000,&length,&res);
  if ((GLint *)param._0_8_ != pGVar2) {
    operator_delete((void *)param._0_8_,param._16_8_ + 1);
  }
  expected3[0] = 5;
  expected3[1] = 0x10;
  expected3[2] = 2;
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x13])(this,(ulong)program,0x92c0,(ulong)(uint)res,3,props2,3,expected3,&error);
  param._0_8_ = pGVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)param,"e","");
  pmVar8 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indicesU,(key_type *)param);
  glu::CallLogWrapper::glGetProgramResourceiv
            (local_2088,program,0x92e1,*pmVar8,1,&prop,1000,&length,&res);
  if ((GLint *)param._0_8_ != pGVar2) {
    operator_delete((void *)param._0_8_,param._16_8_ + 1);
  }
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x13])(this,(ulong)program,0x92c0,(ulong)(uint)res,3,props2,3,expected3,&error);
  prop2 = 0x9305;
  p_Var4 = &exp._M_t._M_impl.super__Rb_tree_header;
  exp._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  exp._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  exp._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  param2._0_8_ = param2 + 4;
  exp._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var4->_M_header;
  exp._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var4->_M_header;
  std::__cxx11::string::_M_construct<char_const*>((string *)param2,"b","");
  pmVar8 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indicesU,(key_type *)param2);
  std::
  _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
  ::_M_insert_unique<unsigned_int_const&>
            ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
              *)&exp,pmVar8);
  if ((GLint *)param2._0_8_ != param2 + 4) {
    operator_delete((void *)param2._0_8_,param2._16_8_ + 1);
  }
  param2._0_8_ = param2 + 4;
  std::__cxx11::string::_M_construct<char_const*>((string *)param2,"c","");
  pmVar8 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indicesU,(key_type *)param2);
  std::
  _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
  ::_M_insert_unique<unsigned_int_const&>
            ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
              *)&exp,pmVar8);
  if ((GLint *)param2._0_8_ != param2 + 4) {
    operator_delete((void *)param2._0_8_,param2._16_8_ + 1);
  }
  param2._0_8_ = param2 + 4;
  std::__cxx11::string::_M_construct<char_const*>((string *)param2,"b","");
  pmVar8 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indicesU,(key_type *)param2);
  glu::CallLogWrapper::glGetProgramResourceiv
            (local_2088,program,0x92e1,*pmVar8,1,&prop,1000,&length,&res);
  if ((GLint *)param2._0_8_ != param2 + 4) {
    operator_delete((void *)param2._0_8_,param2._16_8_ + 1);
  }
  glu::CallLogWrapper::glGetProgramResourceiv
            (local_2088,program,0x92c0,res,1,&prop2,1000,&length,param);
  if (0 < length) {
    uVar12 = 0;
    do {
      if (exp._M_t._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
LAB_008f5cfb:
        anon_unknown_0::Output("Length: %d\n");
        anon_unknown_0::Output
                  ("Unexpected index/length found in active variables of ATOMIC_COUNTER_BUFFER: %d\n"
                   ,(ulong)(uint)param[uVar12]);
        lVar13 = -1;
        glu::CallLogWrapper::glDeleteProgram(local_2088,program);
        goto LAB_008f5d78;
      }
      _Var5 = param[uVar12];
      p_Var11 = &p_Var4->_M_header;
      p_Var7 = exp._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      do {
        p_Var9 = p_Var7;
        p_Var10 = p_Var11;
        _Var6 = p_Var9[1]._M_color;
        p_Var11 = p_Var9;
        if (_Var6 < _Var5) {
          p_Var11 = p_Var10;
        }
        p_Var7 = (&p_Var9->_M_left)[_Var6 < _Var5];
      } while ((&p_Var9->_M_left)[_Var6 < _Var5] != (_Base_ptr)0x0);
      if ((_Rb_tree_header *)p_Var11 == p_Var4) goto LAB_008f5cfb;
      if (_Var6 < _Var5) {
        p_Var9 = p_Var10;
      }
      if ((length != 2) || (_Var5 < p_Var9[1]._M_color)) goto LAB_008f5cfb;
      uVar12 = uVar12 + 1;
    } while (uVar12 != 2);
  }
  anon_unknown_0::Output("GL_ACTIVE_VARIABLES ok for 1st ATOMIC_COUNTER_BUFFER\n");
  p_Var4 = &exp2._M_t._M_impl.super__Rb_tree_header;
  exp2._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  exp2._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  exp2._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  paVar1 = &local_2078.field_2;
  local_2078._M_dataplus._M_p = (pointer)paVar1;
  exp2._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var4->_M_header;
  exp2._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var4->_M_header;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2078,"d","");
  pmVar8 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indicesU,&local_2078);
  std::
  _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
  ::_M_insert_unique<unsigned_int_const&>
            ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
              *)&exp2,pmVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2078._M_dataplus._M_p != paVar1) {
    operator_delete(local_2078._M_dataplus._M_p,local_2078.field_2._M_allocated_capacity + 1);
  }
  local_2078._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2078,"e","");
  pmVar8 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indicesU,&local_2078);
  std::
  _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
  ::_M_insert_unique<unsigned_int_const&>
            ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
              *)&exp2,pmVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2078._M_dataplus._M_p != paVar1) {
    operator_delete(local_2078._M_dataplus._M_p,local_2078.field_2._M_allocated_capacity + 1);
  }
  local_2078._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2078,"d","");
  pmVar8 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indicesU,&local_2078);
  glu::CallLogWrapper::glGetProgramResourceiv
            (local_2088,program,0x92e1,*pmVar8,1,&prop,1000,&length,&res);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2078._M_dataplus._M_p != paVar1) {
    operator_delete(local_2078._M_dataplus._M_p,local_2078.field_2._M_allocated_capacity + 1);
  }
  glu::CallLogWrapper::glGetProgramResourceiv
            (local_2088,program,0x92c0,res,1,&prop2,1000,&length,param2);
  if (0 < length) {
    uVar12 = 0;
    do {
      if (exp2._M_t._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
LAB_008f5d34:
        anon_unknown_0::Output("Length: %d\n");
        anon_unknown_0::Output
                  ("Unexpected index/length found in active variables of ATOMIC_COUNTER_BUFFER: %d\n"
                   ,(ulong)(uint)param2[uVar12]);
        lVar13 = -1;
        glu::CallLogWrapper::glDeleteProgram(local_2088,program);
        goto LAB_008f5d6b;
      }
      _Var5 = param2[uVar12];
      p_Var11 = &p_Var4->_M_header;
      p_Var7 = exp2._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      do {
        p_Var9 = p_Var7;
        p_Var10 = p_Var11;
        _Var6 = p_Var9[1]._M_color;
        p_Var11 = p_Var9;
        if (_Var6 < _Var5) {
          p_Var11 = p_Var10;
        }
        p_Var7 = (&p_Var9->_M_left)[_Var6 < _Var5];
      } while ((&p_Var9->_M_left)[_Var6 < _Var5] != (_Base_ptr)0x0);
      if ((_Rb_tree_header *)p_Var11 == p_Var4) goto LAB_008f5d34;
      if (_Var6 < _Var5) {
        p_Var9 = p_Var10;
      }
      if ((length != 2) || (_Var5 < p_Var9[1]._M_color)) goto LAB_008f5d34;
      uVar12 = uVar12 + 1;
    } while (uVar12 != 2);
  }
  glu::CallLogWrapper::glDeleteProgram(local_2088,program);
  lVar13 = error;
LAB_008f5d6b:
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~_Rb_tree(&exp2._M_t);
LAB_008f5d78:
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~_Rb_tree(&exp._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~_Rb_tree(&indicesU._M_t);
  return lVar13;
}

Assistant:

virtual long Run()
	{
		GLuint program = CreateProgram(VertexShader().c_str(), FragmentShader().c_str(), false);
		glBindAttribLocation(program, 0, "position");
		glBindFragDataLocation(program, 0, "color");
		LinkProgram(program);

		long error = NO_ERROR;

		VerifyGetProgramInterfaceiv(program, GL_ATOMIC_COUNTER_BUFFER, GL_ACTIVE_RESOURCES, 3, error);
		VerifyGetProgramInterfaceiv(program, GL_ATOMIC_COUNTER_BUFFER, GL_MAX_NUM_ACTIVE_VARIABLES, 2, error);

		std::map<std::string, GLuint> indicesU;
		VerifyGetProgramResourceIndex(program, GL_UNIFORM, indicesU, "a", error);
		VerifyGetProgramResourceIndex(program, GL_UNIFORM, indicesU, "b", error);
		VerifyGetProgramResourceIndex(program, GL_UNIFORM, indicesU, "c", error);
		VerifyGetProgramResourceIndex(program, GL_UNIFORM, indicesU, "d", error);
		VerifyGetProgramResourceIndex(program, GL_UNIFORM, indicesU, "e", error);

		VerifyGetProgramResourceName(program, GL_UNIFORM, indicesU["a"], "a", error);
		VerifyGetProgramResourceName(program, GL_UNIFORM, indicesU["b"], "b", error);
		VerifyGetProgramResourceName(program, GL_UNIFORM, indicesU["c"], "c", error);
		VerifyGetProgramResourceName(program, GL_UNIFORM, indicesU["d"], "d[0]", error);
		VerifyGetProgramResourceName(program, GL_UNIFORM, indicesU["e"], "e", error);

		VerifyGetProgramResourceLocation(program, GL_UNIFORM, "a", -1, error);
		VerifyGetProgramResourceLocation(program, GL_UNIFORM, "b", -1, error);
		VerifyGetProgramResourceLocation(program, GL_UNIFORM, "c", -1, error);
		VerifyGetProgramResourceLocation(program, GL_UNIFORM, "d", -1, error);
		VerifyGetProgramResourceLocation(program, GL_UNIFORM, "e", -1, error);
		VerifyGetProgramResourceLocation(program, GL_UNIFORM, "d[0]", -1, error);
		VerifyGetProgramResourceLocation(program, GL_UNIFORM, "d[1]", -1, error);
		VerifyGetProgramResourceLocation(program, GL_UNIFORM, "d[2]", -1, error);

		GLenum		  prop	= GL_ATOMIC_COUNTER_BUFFER_INDEX;
		const GLsizei bufSize = 1000;
		GLsizei		  length;
		GLint		  res;
		glGetProgramResourceiv(program, GL_UNIFORM, indicesU["a"], 1, &prop, bufSize, &length, &res);

		GLenum props[] = { GL_BUFFER_BINDING, GL_BUFFER_DATA_SIZE, GL_NUM_ACTIVE_VARIABLES, GL_ACTIVE_VARIABLES };
		glGetProgramResourceiv(program, GL_UNIFORM, indicesU["a"], 1, &prop, bufSize, &length, &res);
		GLint expected[] = { 1, 4, 1, static_cast<GLint>(indicesU["a"]) };
		VerifyGetProgramResourceiv(program, GL_ATOMIC_COUNTER_BUFFER, res, 4, props, 4, expected, error);

		GLenum props2[] = { GL_BUFFER_BINDING, GL_BUFFER_DATA_SIZE, GL_NUM_ACTIVE_VARIABLES };
		glGetProgramResourceiv(program, GL_UNIFORM, indicesU["b"], 1, &prop, bufSize, &length, &res);
		GLint expected2[] = { 2, 8, 2 };
		VerifyGetProgramResourceiv(program, GL_ATOMIC_COUNTER_BUFFER, res, 3, props2, 3, expected2, error);
		glGetProgramResourceiv(program, GL_UNIFORM, indicesU["c"], 1, &prop, bufSize, &length, &res);
		VerifyGetProgramResourceiv(program, GL_ATOMIC_COUNTER_BUFFER, res, 3, props2, 3, expected2, error);

		glGetProgramResourceiv(program, GL_UNIFORM, indicesU["d"], 1, &prop, bufSize, &length, &res);
		GLint expected3[] = { 5, 16, 2 };
		VerifyGetProgramResourceiv(program, GL_ATOMIC_COUNTER_BUFFER, res, 3, props2, 3, expected3, error);
		glGetProgramResourceiv(program, GL_UNIFORM, indicesU["e"], 1, &prop, bufSize, &length, &res);
		VerifyGetProgramResourceiv(program, GL_ATOMIC_COUNTER_BUFFER, res, 3, props2, 3, expected3, error);

		GLenum			 prop2 = GL_ACTIVE_VARIABLES;
		GLint			 param[bufSize];
		std::set<GLuint> exp;
		exp.insert(indicesU["b"]);
		exp.insert(indicesU["c"]);
		glGetProgramResourceiv(program, GL_UNIFORM, indicesU["b"], 1, &prop, bufSize, &length, &res);
		glGetProgramResourceiv(program, GL_ATOMIC_COUNTER_BUFFER, res, 1, &prop2, bufSize, &length, param);
		for (int i = 0; i < length; ++i)
		{
			if (exp.find(param[i]) == exp.end() || length != 2)
			{
				Output("Length: %d\n", length);
				Output("Unexpected index/length found in active variables of ATOMIC_COUNTER_BUFFER: %d\n", param[i]);
				glDeleteProgram(program);
				return ERROR;
			}
		}
		Output("GL_ACTIVE_VARIABLES ok for 1st ATOMIC_COUNTER_BUFFER\n");
		std::set<GLuint> exp2;
		GLint			 param2[bufSize];
		exp2.insert(indicesU["d"]);
		exp2.insert(indicesU["e"]);
		glGetProgramResourceiv(program, GL_UNIFORM, indicesU["d"], 1, &prop, bufSize, &length, &res);
		glGetProgramResourceiv(program, GL_ATOMIC_COUNTER_BUFFER, res, 1, &prop2, bufSize, &length, param2);
		for (int i = 0; i < length; ++i)
		{
			if (exp2.find(param2[i]) == exp2.end() || length != 2)
			{
				Output("Length: %d\n", length);
				Output("Unexpected index/length found in active variables of ATOMIC_COUNTER_BUFFER: %d\n", param2[i]);
				glDeleteProgram(program);
				return ERROR;
			}
		}

		glDeleteProgram(program);
		return error;
	}